

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O3

void aom_paeth_predictor_4x16_ssse3(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  undefined1 auVar1 [16];
  undefined4 uVar2;
  undefined7 uVar3;
  uint7 uVar4;
  int iVar5;
  ushort uVar6;
  byte bVar7;
  short sVar8;
  short sVar11;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  short sVar17;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  undefined1 auVar18 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  short sVar13;
  short sVar14;
  
  auVar1 = *(undefined1 (*) [16])left;
  uVar2 = *(undefined4 *)above;
  bVar7 = (byte)((uint)uVar2 >> 0x18);
  uVar3 = CONCAT25((short)(((uint7)bVar7 << 0x30) >> 0x28),
                   CONCAT14((char)((uint)uVar2 >> 0x10),uVar2));
  uVar4 = (uint7)CONCAT41((int)(CONCAT34((int3)((uint7)uVar3 >> 0x20),uVar2) >> 0x18),
                          (char)((uint)uVar2 >> 8)) & 0xffffff00ff;
  uVar6 = (ushort)(byte)uVar2;
  auVar9 = pshuflw(ZEXT116(above[-1]),ZEXT116(above[-1]),0);
  auVar10._0_4_ = auVar9._0_4_;
  auVar10._4_4_ = auVar10._0_4_;
  auVar10._8_4_ = auVar10._0_4_;
  auVar10._12_4_ = auVar10._0_4_;
  sVar8 = auVar9._0_2_;
  auVar12._0_2_ = uVar6 - sVar8;
  sVar11 = auVar9._2_2_;
  sVar13 = (short)uVar4;
  auVar12._2_2_ = sVar13 - sVar11;
  sVar14 = (short)((uint7)uVar3 >> 0x20);
  auVar12._4_2_ = sVar14 - sVar8;
  auVar12._6_2_ = (ushort)bVar7 - sVar11;
  auVar12._8_2_ = -sVar8;
  auVar12._10_2_ = -sVar11;
  auVar12._12_2_ = -sVar8;
  auVar12._14_2_ = -sVar11;
  auVar15 = pabsw(in_XMM4,auVar12);
  iVar5 = 0x10;
  auVar9 = _DAT_004d27e0;
  do {
    auVar16 = pshufb(auVar1,auVar9);
    sVar17 = auVar12._0_2_ + auVar16._0_2_;
    sVar19 = auVar12._2_2_ + auVar16._2_2_;
    sVar20 = auVar12._4_2_ + auVar16._4_2_;
    sVar21 = auVar12._6_2_ + auVar16._6_2_;
    sVar22 = -sVar8 + auVar16._8_2_;
    sVar23 = -sVar11 + auVar16._10_2_;
    sVar24 = -sVar8 + auVar16._12_2_;
    sVar25 = -sVar11 + auVar16._14_2_;
    auVar26._0_2_ = sVar17 - uVar6;
    auVar26._2_2_ = sVar19 - sVar13;
    auVar26._4_2_ = sVar20 - sVar14;
    auVar26._6_2_ = sVar21 - (ushort)bVar7;
    auVar26._8_2_ = sVar22;
    auVar26._10_2_ = sVar23;
    auVar26._12_2_ = sVar24;
    auVar26._14_2_ = sVar25;
    auVar26 = pabsw(auVar26,auVar26);
    auVar18._0_2_ = sVar17 - sVar8;
    auVar18._2_2_ = sVar19 - sVar11;
    auVar18._4_2_ = sVar20 - sVar8;
    auVar18._6_2_ = sVar21 - sVar11;
    auVar18._8_2_ = sVar22 - sVar8;
    auVar18._10_2_ = sVar23 - sVar11;
    auVar18._12_2_ = sVar24 - sVar8;
    auVar18._14_2_ = sVar25 - sVar11;
    auVar18 = pabsw(auVar18,auVar18);
    auVar28._0_2_ = -(ushort)(auVar26._0_2_ < auVar15._0_2_);
    auVar28._2_2_ = -(ushort)(auVar26._2_2_ < auVar15._2_2_);
    auVar28._4_2_ = -(ushort)(auVar26._4_2_ < auVar15._4_2_);
    auVar28._6_2_ = -(ushort)(auVar26._6_2_ < auVar15._6_2_);
    auVar28._8_2_ = -(ushort)(auVar26._8_2_ < auVar15._8_2_);
    auVar28._10_2_ = -(ushort)(auVar26._10_2_ < auVar15._10_2_);
    auVar28._12_2_ = -(ushort)(auVar26._12_2_ < auVar15._12_2_);
    auVar28._14_2_ = -(ushort)(auVar26._14_2_ < auVar15._14_2_);
    auVar29._0_2_ = -(ushort)(auVar18._0_2_ < auVar15._0_2_);
    auVar29._2_2_ = -(ushort)(auVar18._2_2_ < auVar15._2_2_);
    auVar29._4_2_ = -(ushort)(auVar18._4_2_ < auVar15._4_2_);
    auVar29._6_2_ = -(ushort)(auVar18._6_2_ < auVar15._6_2_);
    auVar29._8_2_ = -(ushort)(auVar18._8_2_ < auVar15._8_2_);
    auVar29._10_2_ = -(ushort)(auVar18._10_2_ < auVar15._10_2_);
    auVar29._12_2_ = -(ushort)(auVar18._12_2_ < auVar15._12_2_);
    auVar29._14_2_ = -(ushort)(auVar18._14_2_ < auVar15._14_2_);
    auVar27._0_2_ = -(ushort)(auVar18._0_2_ < auVar26._0_2_);
    auVar27._2_2_ = -(ushort)(auVar18._2_2_ < auVar26._2_2_);
    auVar27._4_2_ = -(ushort)(auVar18._4_2_ < auVar26._4_2_);
    auVar27._6_2_ = -(ushort)(auVar18._6_2_ < auVar26._6_2_);
    auVar27._8_2_ = -(ushort)(auVar18._8_2_ < auVar26._8_2_);
    auVar27._10_2_ = -(ushort)(auVar18._10_2_ < auVar26._10_2_);
    auVar27._12_2_ = -(ushort)(auVar18._12_2_ < auVar26._12_2_);
    auVar27._14_2_ = -(ushort)(auVar18._14_2_ < auVar26._14_2_);
    auVar16 = ~(auVar29 | auVar28) & auVar16 |
              (~auVar27 & ZEXT716(CONCAT52((int5)uVar4,uVar6)) | auVar10 & auVar27) &
              (auVar29 | auVar28);
    sVar17 = auVar16._0_2_;
    sVar19 = auVar16._2_2_;
    sVar20 = auVar16._4_2_;
    sVar21 = auVar16._6_2_;
    *(uint *)dst = CONCAT13((0 < sVar21) * (sVar21 < 0x100) * auVar16[6] - (0xff < sVar21),
                            CONCAT12((0 < sVar20) * (sVar20 < 0x100) * auVar16[4] - (0xff < sVar20),
                                     CONCAT11((0 < sVar19) * (sVar19 < 0x100) * auVar16[2] -
                                              (0xff < sVar19),
                                              (0 < sVar17) * (sVar17 < 0x100) * auVar16[0] -
                                              (0xff < sVar17))));
    dst = dst + stride;
    auVar16._0_2_ = auVar9._0_2_ + 1;
    auVar16._2_2_ = auVar9._2_2_ + 1;
    auVar16._4_2_ = auVar9._4_2_ + 1;
    auVar16._6_2_ = auVar9._6_2_ + 1;
    auVar16._8_2_ = auVar9._8_2_ + 1;
    auVar16._10_2_ = auVar9._10_2_ + 1;
    auVar16._12_2_ = auVar9._12_2_ + 1;
    auVar16._14_2_ = auVar9._14_2_ + 1;
    iVar5 = iVar5 + -1;
    auVar9 = auVar16;
  } while (iVar5 != 0);
  return;
}

Assistant:

void aom_paeth_predictor_4x16_ssse3(uint8_t *dst, ptrdiff_t stride,
                                    const uint8_t *above, const uint8_t *left) {
  __m128i l = _mm_load_si128((const __m128i *)left);
  const __m128i t = _mm_cvtsi32_si128(((const int *)above)[0]);
  const __m128i zero = _mm_setzero_si128();
  const __m128i t16 = _mm_unpacklo_epi8(t, zero);
  const __m128i tl16 = _mm_set1_epi16((int16_t)above[-1]);
  __m128i rep = _mm_set1_epi16((short)0x8000);
  const __m128i one = _mm_set1_epi16(1);

  for (int i = 0; i < 16; ++i) {
    const __m128i l16 = _mm_shuffle_epi8(l, rep);
    const __m128i row = paeth_8x1_pred(&l16, &t16, &tl16);

    *(int *)dst = _mm_cvtsi128_si32(_mm_packus_epi16(row, row));
    dst += stride;
    rep = _mm_add_epi16(rep, one);
  }
}